

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore.hpp
# Opt level: O2

__pid_t __thiscall tlx::Semaphore::wait(Semaphore *this,void *__stat_loc)

{
  long in_RDX;
  size_t sVar1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_40;
  
  std::unique_lock<std::mutex>::unique_lock(&local_40,&this->mutex_);
  while (this->value_ < (ulong)(in_RDX + (long)__stat_loc)) {
    std::condition_variable::wait((unique_lock *)&this->cv_);
  }
  sVar1 = this->value_ - (long)__stat_loc;
  this->value_ = sVar1;
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return (__pid_t)sVar1;
}

Assistant:

size_t wait(size_t delta = 1, size_t slack = 0) {
        std::unique_lock<std::mutex> lock(mutex_);
        while (value_ < delta + slack)
            cv_.wait(lock);
        value_ -= delta;
        return value_;
    }